

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O1

TA_RetCode TA_SetOptInputParamInteger(TA_ParamHolder *param,uint paramIndex,TA_Integer value)

{
  int *piVar1;
  uint *puVar2;
  TA_RetCode TVar3;
  
  TVar3 = TA_BAD_PARAM;
  if (param != (TA_ParamHolder *)0x0) {
    piVar1 = (int *)param->hiddenData;
    TVar3 = TA_INVALID_PARAM_HOLDER;
    if (*piVar1 == -0x5dfd4dfe) {
      if (*(long *)(piVar1 + 10) == 0) {
        return TA_INVALID_HANDLE;
      }
      TVar3 = TA_BAD_PARAM;
      if (paramIndex < *(uint *)(*(long *)(piVar1 + 10) + 0x28)) {
        puVar2 = *(uint **)(*(long *)(piVar1 + 4) + 8 + (ulong)paramIndex * 0x10);
        if (puVar2 == (uint *)0x0) {
          return TA_INTERNAL_ERROR|TA_BAD_PARAM;
        }
        TVar3 = TA_INVALID_PARAM_HOLDER_TYPE;
        if ((*puVar2 & 0xfffffffe) == 2) {
          *(TA_Integer *)(*(long *)(piVar1 + 4) + (ulong)paramIndex * 0x10) = value;
          TVar3 = TA_SUCCESS;
        }
      }
    }
  }
  return TVar3;
}

Assistant:

TA_RetCode TA_SetOptInputParamInteger( TA_ParamHolder *param,
                                       unsigned int paramIndex,
                                       TA_Integer value )
{

   TA_ParamHolderPriv *paramHolderPriv;
   const TA_OptInputParameterInfo *paramInfo;
   const TA_FuncInfo *funcInfo;

   if( param == NULL )
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Make sure this index really exist. */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;
   if( paramIndex >= funcInfo->nbOptInput )
   {
      return TA_BAD_PARAM;
   }

   /* Verify the type of the parameter. */
   paramInfo = paramHolderPriv->optIn[paramIndex].optInputInfo;
   if( !paramInfo ) return TA_INTERNAL_ERROR(2);
   if( (paramInfo->type != TA_OptInput_IntegerRange) &&
       (paramInfo->type != TA_OptInput_IntegerList) )
   {
      return TA_INVALID_PARAM_HOLDER_TYPE;
   }

   /* keep a copy of the provided parameter. */
   paramHolderPriv->optIn[paramIndex].data.optInInteger = value;

   return TA_SUCCESS;
}